

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O1

int evmap_make_space(event_signal_map *map,int slot,int msize)

{
  int iVar1;
  void **ppvVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = map->nentries;
  iVar4 = 0;
  if ((iVar3 <= slot) && (iVar4 = -1, slot < 0x40000000)) {
    iVar1 = 0x20;
    if (iVar3 != 0) {
      iVar1 = iVar3;
    }
    do {
      iVar3 = iVar1;
      iVar1 = iVar3 * 2;
    } while (iVar3 <= slot);
    if (iVar3 < 0x10000000) {
      ppvVar2 = (void **)event_mm_realloc_(map->entries,(ulong)(uint)(iVar3 * 8));
      if (ppvVar2 != (void **)0x0) {
        iVar4 = 0;
        memset(ppvVar2 + map->nentries,0,((long)iVar3 - (long)map->nentries) * 8);
        map->nentries = iVar3;
        map->entries = ppvVar2;
      }
    }
  }
  return iVar4;
}

Assistant:

static int
evmap_make_space(struct event_signal_map *map, int slot, int msize)
{
	if (map->nentries <= slot) {
		int nentries = map->nentries ? map->nentries : 32;
		void **tmp;

		if (slot > INT_MAX / 2)
			return (-1);

		while (nentries <= slot)
			nentries <<= 1;

		if (nentries > INT_MAX / msize)
			return (-1);

		tmp = (void **)mm_realloc(map->entries, nentries * msize);
		if (tmp == NULL)
			return (-1);

		memset(&tmp[map->nentries], 0,
		    (nentries - map->nentries) * msize);

		map->nentries = nentries;
		map->entries = tmp;
	}

	return (0);
}